

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Block * __thiscall wasm::Builder::blockify(Builder *this,Expression *any,Expression *append)

{
  Block *local_28;
  Block *block;
  Expression *append_local;
  Expression *any_local;
  Builder *this_local;
  
  local_28 = (Block *)0x0;
  if (any != (Expression *)0x0) {
    local_28 = Expression::dynCast<wasm::Block>(any);
  }
  if (local_28 == (Block *)0x0) {
    local_28 = makeBlock(this,any);
  }
  if (append != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_28->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
    Block::finalize(local_28);
  }
  return local_28;
}

Assistant:

Block* blockify(Expression* any, Expression* append = nullptr) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block) {
      block = makeBlock(any);
    }
    if (append) {
      block->list.push_back(append);
      block->finalize();
    }
    return block;
  }